

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port_connector_list.c
# Opt level: O0

apx_error_t
apx_portConnectorList_insert(apx_portConnectorList_t *self,apx_portInstance_t *port_instance)

{
  adt_error_t aVar1;
  undefined4 local_24;
  adt_error_t result;
  apx_error_t retval;
  apx_portInstance_t *port_instance_local;
  apx_portConnectorList_t *self_local;
  
  if ((self == (apx_portConnectorList_t *)0x0) || (port_instance == (apx_portInstance_t *)0x0)) {
    self_local._4_4_ = 1;
  }
  else {
    local_24 = 0;
    aVar1 = adt_ary_push(&self->require_ports,port_instance);
    if (aVar1 != '\0') {
      if (aVar1 == '\x02') {
        local_24 = 2;
      }
      else {
        local_24 = -1;
      }
    }
    self_local._4_4_ = local_24;
  }
  return self_local._4_4_;
}

Assistant:

apx_error_t apx_portConnectorList_insert(apx_portConnectorList_t* self, apx_portInstance_t* port_instance)
{
   if ( (self != NULL) && (port_instance != NULL) )
   {
      apx_error_t retval = APX_NO_ERROR;
      adt_error_t result = adt_ary_push(&self->require_ports, (void*)port_instance);
      if (result != ADT_NO_ERROR)
      {
         if (result == ADT_MEM_ERROR)
         {
            retval = APX_MEM_ERROR;
         }
         else
         {
            retval = APX_GENERIC_ERROR; //unhandled error
         }
      }
      return retval;
   }
   return APX_INVALID_ARGUMENT_ERROR;
}